

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor::MergeFrom
          (BayesianProbitRegressor *this,BayesianProbitRegressor *from)

{
  ulong uVar1;
  LogMessage *other;
  BayesianProbitRegressor_Gaussian *this_00;
  undefined8 *puVar2;
  ulong uVar3;
  undefined1 *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/BayesianProbitRegressor.pb.cc"
               ,0x50c);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
            (&(this->features_).super_RepeatedPtrFieldBase,
             &(from->features_).super_RepeatedPtrFieldBase);
  uVar3 = (ulong)(from->regressioninputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->regressioninputfeaturename_,uVar3,puVar2)
    ;
  }
  uVar3 = (ulong)(from->optimisminputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->optimisminputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->samplingscaleinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingscaleinputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->samplingtruncationinputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->samplingtruncationinputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->meanoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->meanoutputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->varianceoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set(&this->varianceoutputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->pessimisticprobabilityoutputfeaturename_).tagged_ptr_.ptr_ &
          0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->pessimisticprobabilityoutputfeaturename_,uVar3,puVar2);
  }
  uVar3 = (ulong)(from->sampledprobabilityoutputfeaturename_).tagged_ptr_.ptr_ & 0xfffffffffffffffe;
  if (*(long *)(uVar3 + 8) != 0) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    google::protobuf::internal::ArenaStringPtr::Set
              (&this->sampledprobabilityoutputfeaturename_,uVar3,puVar2);
  }
  if ((from != (BayesianProbitRegressor *)_BayesianProbitRegressor_default_instance_) &&
     (from->bias_ != (BayesianProbitRegressor_Gaussian *)0x0)) {
    this_00 = _internal_mutable_bias(this);
    from_00 = (undefined1 *)from->bias_;
    if ((BayesianProbitRegressor_Gaussian *)from_00 == (BayesianProbitRegressor_Gaussian *)0x0) {
      from_00 = _BayesianProbitRegressor_Gaussian_default_instance_;
    }
    BayesianProbitRegressor_Gaussian::MergeFrom(this_00,(BayesianProbitRegressor_Gaussian *)from_00)
    ;
  }
  if (from->numberoffeatures_ != 0) {
    this->numberoffeatures_ = from->numberoffeatures_;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void BayesianProbitRegressor::MergeFrom(const BayesianProbitRegressor& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BayesianProbitRegressor)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  features_.MergeFrom(from.features_);
  if (!from._internal_regressioninputfeaturename().empty()) {
    _internal_set_regressioninputfeaturename(from._internal_regressioninputfeaturename());
  }
  if (!from._internal_optimisminputfeaturename().empty()) {
    _internal_set_optimisminputfeaturename(from._internal_optimisminputfeaturename());
  }
  if (!from._internal_samplingscaleinputfeaturename().empty()) {
    _internal_set_samplingscaleinputfeaturename(from._internal_samplingscaleinputfeaturename());
  }
  if (!from._internal_samplingtruncationinputfeaturename().empty()) {
    _internal_set_samplingtruncationinputfeaturename(from._internal_samplingtruncationinputfeaturename());
  }
  if (!from._internal_meanoutputfeaturename().empty()) {
    _internal_set_meanoutputfeaturename(from._internal_meanoutputfeaturename());
  }
  if (!from._internal_varianceoutputfeaturename().empty()) {
    _internal_set_varianceoutputfeaturename(from._internal_varianceoutputfeaturename());
  }
  if (!from._internal_pessimisticprobabilityoutputfeaturename().empty()) {
    _internal_set_pessimisticprobabilityoutputfeaturename(from._internal_pessimisticprobabilityoutputfeaturename());
  }
  if (!from._internal_sampledprobabilityoutputfeaturename().empty()) {
    _internal_set_sampledprobabilityoutputfeaturename(from._internal_sampledprobabilityoutputfeaturename());
  }
  if (from._internal_has_bias()) {
    _internal_mutable_bias()->::CoreML::Specification::BayesianProbitRegressor_Gaussian::MergeFrom(from._internal_bias());
  }
  if (from._internal_numberoffeatures() != 0) {
    _internal_set_numberoffeatures(from._internal_numberoffeatures());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}